

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_lib.c
# Opt level: O0

uint16_t ossl_ifc_ffc_compute_security_bits(int n)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  uint64_t uVar3;
  int in_EDI;
  uint16_t cap;
  uint16_t y;
  uint32_t lx;
  uint64_t x;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 local_18;
  undefined2 local_16;
  undefined2 local_2;
  
  if (in_EDI == 0x800) {
    local_2 = 0x70;
  }
  else if (in_EDI == 0xc00) {
    local_2 = 0x80;
  }
  else if (in_EDI == 0x1000) {
    local_2 = 0x98;
  }
  else if (in_EDI == 0x1800) {
    local_2 = 0xb0;
  }
  else if (in_EDI == 0x1e00) {
    local_2 = 0xc0;
  }
  else if (in_EDI == 0x2000) {
    local_2 = 200;
  }
  else if (in_EDI == 0x3c00) {
    local_2 = 0x100;
  }
  else if (in_EDI < 0xa7e79) {
    if (in_EDI < 8) {
      local_2 = 0;
    }
    else {
      if (in_EDI < 0x1e01) {
        local_18 = 0xc0;
      }
      else if (in_EDI < 0x3c01) {
        local_18 = 0x100;
      }
      else {
        local_18 = 0x4b0;
      }
      uVar2 = ilog_e(CONCAT44(in_EDI,in_stack_ffffffffffffffe0));
      uVar3 = mul2((long)in_EDI * 0x2c5c8,(ulong)uVar2);
      uVar3 = mul2(uVar3,(ulong)uVar2);
      uVar3 = icbrt64(uVar3);
      uVar3 = mul2(0x7b126,uVar3);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar3 - 0x12c28f;
      local_16 = SUB162(auVar1 / ZEXT816(0x2c5c8),0) + 4U & 0xfff8;
      if (local_18 < local_16) {
        local_16 = local_18;
      }
      local_2 = local_16;
    }
  }
  else {
    local_2 = 0x4b0;
  }
  return local_2;
}

Assistant:

uint16_t ossl_ifc_ffc_compute_security_bits(int n)
{
    uint64_t x;
    uint32_t lx;
    uint16_t y, cap;

    /*
     * Look for common values as listed in standards.
     * These values are not exactly equal to the results from the formulae in
     * the standards but are defined to be canonical.
     */
    switch (n) {
    case 2048:      /* SP 800-56B rev 2 Appendix D and FIPS 140-2 IG 7.5 */
        return 112;
    case 3072:      /* SP 800-56B rev 2 Appendix D and FIPS 140-2 IG 7.5 */
        return 128;
    case 4096:      /* SP 800-56B rev 2 Appendix D */
        return 152;
    case 6144:      /* SP 800-56B rev 2 Appendix D */
        return 176;
    case 7680:      /* FIPS 140-2 IG 7.5 */
        return 192;
    case 8192:      /* SP 800-56B rev 2 Appendix D */
        return 200;
    case 15360:     /* FIPS 140-2 IG 7.5 */
        return 256;
    }

    /*
     * The first incorrect result (i.e. not accurate or off by one low) occurs
     * for n = 699668.  The true value here is 1200.  Instead of using this n
     * as the check threshold, the smallest n such that the correct result is
     * 1200 is used instead.
     */
    if (n >= 687737)
        return 1200;
    if (n < 8)
        return 0;

    /*
     * To ensure that the output is non-decreasing with respect to n,
     * a cap needs to be applied to the two values where the function over
     * estimates the strength (according to the above fast path).
     */
    if (n <= 7680)
        cap = 192;
    else if (n <= 15360)
        cap = 256;
    else
        cap = 1200;

    x = n * (uint64_t)log_2;
    lx = ilog_e(x);
    y = (uint16_t)((mul2(c1_923, icbrt64(mul2(mul2(x, lx), lx))) - c4_690)
                   / log_2);
    y = (y + 4) & ~7;
    if (y > cap)
        y = cap;
    return y;
}